

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibtexreader.hpp
# Opt level: O1

bool bibtex::
     read<char,std::char_traits<char>,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
               (basic_istream<char,_std::char_traits<char>_> *in,
               vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_> *entries)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_68;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_58;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_48;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_38;
  
  lVar2 = *(long *)(*(long *)in + -0x18);
  uVar1 = *(uint *)(in + lVar2 + 0x18);
  *(uint *)(in + lVar2 + 0x18) = uVar1 & 0xffffefff;
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::multi_pass(&local_58,in);
  local_68.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
  .member = (shared<std::basic_istream<char,_std::char_traits<char>_>_> *)0x0;
  local_68.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
  super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
  .super_unique<char>.queued_position =
       (multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
        )(unique<char>)0x0;
  local_38.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
  .member = local_58.
            super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
            .member;
  local_38.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
  super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
  .super_unique<char>.queued_position =
       local_58.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
       super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
       .super_unique<char>.queued_position;
  if (local_58.
      super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
      .member != (shared<std::basic_istream<char,_std::char_traits<char>_>_> *)0x0) {
    LOCK();
    ((local_58.
      super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
     .member)->
    super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
    ).super_shared.count.value_ =
         ((local_58.
           super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
          .member)->
         super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
         ).super_shared.count.value_ + 1;
    UNLOCK();
  }
  local_48.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
  .member = (shared<std::basic_istream<char,_std::char_traits<char>_>_> *)0x0;
  local_48.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
  super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
  .super_unique<char>.queued_position =
       (multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
        )(unique<char>)0x0;
  bVar3 = read<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,1l>>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,2l>const,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
                    ((basic_istream_iterator<char,_std::char_traits<char>_> *)&local_38,
                     (basic_istream_iterator<char,_std::char_traits<char>_> *)&local_48,
                     (expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>
                      *)&space,entries,
                     (enable_if<boost::is_same<bibtex::BibTeXEntry,_bibtex::BibTeXEntry>,_void> *)
                     0x0);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_48);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_38);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_68);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_58);
  *(uint *)(in + lVar2 + 0x18) = uVar1;
  return bVar3;
}

Assistant:

inline bool read(std::basic_istream<E, T>& in, Container& entries)
{
    boost::io::ios_flags_saver saver(in);
    in.unsetf(std::ios_base::skipws);

    typedef boost::spirit::basic_istream_iterator<E> istream_iterator;
    return read(istream_iterator(in), istream_iterator(), entries);
}